

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall string::quote_end::test_method(quote_end *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  JSONParser local_140;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  undefined4 local_c8;
  JSONType local_c4;
  basic_cstring<const_char> local_c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b0;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78;
  undefined1 local_68 [8];
  JSONParser parser;
  allocator local_31;
  string local_30 [8];
  string json;
  quote_end *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"\"This is a quote\\\"\"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  yajp::JSONParser::JSONParser((JSONParser *)local_68,(string *)local_30,false);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_78,0x4a,&local_88);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b0,plVar3,(char (*) [1])0x12473b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
               ,0x61);
    local_c4 = yajp::JSONParser::getNextType((JSONParser *)local_68,false);
    local_c8 = 0x22;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,yajp::JSONParser::JSONType,yajp::JSONParser::JSONType>
              (&local_b0,&local_c0,0x4a,1,2,&local_c4,"parser.getNextType()",&local_c8,
               "yajp::JSONParser::string");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x4b,&local_e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,plVar3,(char (*) [1])0x12473b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
               ,0x61);
    yajp::JSONParser::readString_abi_cxx11_(&local_140);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[17],std::__cxx11::string>
              (&local_110,&local_120,0x4b,1,2,"This is a quote\"","\"This is a quote\\\"\"",
               &local_140,"parser.readString()");
    std::__cxx11::string::~string((string *)&local_140);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( quote_end ) {
    std::string json("\"This is a quote\\\"\"");
    yajp::JSONParser parser(json);
    BOOST_CHECK_EQUAL(parser.getNextType(), yajp::JSONParser::string);
    BOOST_CHECK_EQUAL("This is a quote\"", parser.readString());
}